

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlRelaxNGSetValidErrors(PyObject *self,PyObject *args)

{
  long *plVar1;
  int iVar2;
  PyObject *pPVar3;
  undefined8 uVar4;
  int val;
  xmlRelaxNGValidCtxtPyCtxtPtr pyCtxt;
  PyObject *pyobj_arg;
  PyObject *pyobj_ctx;
  PyObject *pyobj_warn;
  PyObject *pyobj_error;
  undefined8 *local_38;
  long *local_30;
  undefined *local_28;
  long *local_20;
  long *local_18;
  
  local_30 = (long *)&_Py_NoneStruct;
  iVar2 = _PyArg_ParseTuple_SizeT
                    (args,"OOO|O:xmlRelaxNGSetValidErrors",&local_28,&local_18,&local_20);
  if (iVar2 == 0) {
    return (PyObject *)0x0;
  }
  if (local_28 == &_Py_NoneStruct) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(undefined8 *)(local_28 + 0x10);
  }
  iVar2 = xmlRelaxNGGetValidErrors(uVar4,0,0,&local_38);
  val = -1;
  if (iVar2 != -1) {
    if (local_38 == (undefined8 *)0x0) {
      local_38 = (undefined8 *)(*_xmlMalloc)(0x18);
      if (local_38 == (undefined8 *)0x0) goto LAB_0013e477;
      *local_38 = 0;
      local_38[1] = 0;
      local_38[2] = 0;
    }
    plVar1 = (long *)local_38[1];
    if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
      _Py_Dealloc();
    }
    if (local_18 != (long *)0x0) {
      *local_18 = *local_18 + 1;
    }
    local_38[1] = local_18;
    plVar1 = (long *)*local_38;
    if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
      _Py_Dealloc();
    }
    if (local_20 != (long *)0x0) {
      *local_20 = *local_20 + 1;
    }
    *local_38 = local_20;
    plVar1 = (long *)local_38[2];
    if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
      _Py_Dealloc();
    }
    if (local_30 != (long *)0x0) {
      *local_30 = *local_30 + 1;
    }
    local_38[2] = local_30;
    xmlRelaxNGSetValidErrors
              (uVar4,libxml_xmlRelaxNGValidityErrorFunc,libxml_xmlRelaxNGValidityWarningFunc);
    val = 1;
  }
LAB_0013e477:
  pPVar3 = libxml_intWrap(val);
  return pPVar3;
}

Assistant:

static PyObject *
libxml_xmlRelaxNGSetValidErrors(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_retval;
    PyObject *pyobj_error;
    PyObject *pyobj_warn;
    PyObject *pyobj_ctx;
    PyObject *pyobj_arg = Py_None;
    xmlRelaxNGValidCtxtPtr ctxt;
    xmlRelaxNGValidCtxtPyCtxtPtr pyCtxt;

    if (!PyArg_ParseTuple
        (args, (char *) "OOO|O:xmlRelaxNGSetValidErrors", &pyobj_ctx, &pyobj_error, &pyobj_warn, &pyobj_arg))
        return (NULL);

    ctxt = PyrelaxNgValidCtxt_Get(pyobj_ctx);
    if (xmlRelaxNGGetValidErrors(ctxt, NULL, NULL, (void **) &pyCtxt) == -1)
    {
        py_retval = libxml_intWrap(-1);
        return(py_retval);
    }
    
    if (pyCtxt == NULL)
    {
        /* first time to set the error handlers */
        pyCtxt = xmlMalloc(sizeof(xmlRelaxNGValidCtxtPyCtxt));
        if (pyCtxt == NULL) {
            py_retval = libxml_intWrap(-1);
            return(py_retval);
        }
        memset(pyCtxt, 0, sizeof(xmlRelaxNGValidCtxtPyCtxt));
    }
    
    /* TODO: check warn and error is a function ! */
    Py_XDECREF(pyCtxt->error);
    Py_XINCREF(pyobj_error);
    pyCtxt->error = pyobj_error;
    
    Py_XDECREF(pyCtxt->warn);
    Py_XINCREF(pyobj_warn);
    pyCtxt->warn = pyobj_warn;
    
    Py_XDECREF(pyCtxt->arg);
    Py_XINCREF(pyobj_arg);
    pyCtxt->arg = pyobj_arg;

    xmlRelaxNGSetValidErrors(ctxt, &libxml_xmlRelaxNGValidityErrorFunc, &libxml_xmlRelaxNGValidityWarningFunc, pyCtxt);

    py_retval = libxml_intWrap(1);
    return (py_retval);
}